

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  long lVar1;
  long len;
  longlong pos;
  long local_30;
  longlong local_28;
  
  lVar1 = Parse(this,&local_28,&local_30);
  if (-1 < lVar1) {
    do {
      if (lVar1 != 0) {
        if (this->m_entries_count < 1) {
          *pLast = (BlockEntry *)0x0;
        }
        else {
          *pLast = this->m_entries[this->m_entries_count + -1];
        }
        return 0;
      }
      lVar1 = Parse(this,&local_28,&local_30);
    } while (-1 < lVar1);
  }
  *pLast = (BlockEntry *)0x0;
  return lVar1;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}